

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int luaopen_jit(lua_State *L)

{
  lua_State *L_local;
  
  jit_init(L);
  lua_pushlstring(L,"Linux",5);
  lua_pushlstring(L,"x64",3);
  lua_pushinteger(L,0x4e84);
  lua_pushlstring(L,"LuaJIT 2.1.0-beta3",0x12);
  lj_lib_register(L,"jit",lj_lib_init_jit,lj_lib_cf_jit);
  lj_lib_prereg(L,"jit.profile",luaopen_jit_profile,(GCtab *)(L->env).gcptr64);
  lj_lib_prereg(L,"jit.util",luaopen_jit_util,(GCtab *)(L->env).gcptr64);
  lj_lib_register(L,"jit.opt",lj_lib_init_jit_opt,lj_lib_cf_jit_opt);
  L->top = L->top + -2;
  return 1;
}

Assistant:

LUALIB_API int luaopen_jit(lua_State *L)
{
#if LJ_HASJIT
  jit_init(L);
#endif
  lua_pushliteral(L, LJ_OS_NAME);
  lua_pushliteral(L, LJ_ARCH_NAME);
  lua_pushinteger(L, LUAJIT_VERSION_NUM);
  lua_pushliteral(L, LUAJIT_VERSION);
  LJ_LIB_REG(L, LUA_JITLIBNAME, jit);
#if LJ_HASPROFILE
  lj_lib_prereg(L, LUA_JITLIBNAME ".profile", luaopen_jit_profile,
		tabref(L->env));
#endif
#ifndef LUAJIT_DISABLE_JITUTIL
  lj_lib_prereg(L, LUA_JITLIBNAME ".util", luaopen_jit_util, tabref(L->env));
#endif
#if LJ_HASJIT
  LJ_LIB_REG(L, "jit.opt", jit_opt);
#endif
  L->top -= 2;
  return 1;
}